

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *this,iterator it)

{
  iterator iVar1;
  BuildsystemDirectoryStateType local_1d0;
  
  memset(&local_1d0,0,0x1a0);
  local_1d0.Location._M_string_length = 0;
  local_1d0.Location.field_2._M_local_buf[0] = '\0';
  local_1d0.OutputLocation._M_dataplus._M_p = (pointer)&local_1d0.OutputLocation.field_2;
  local_1d0.OutputLocation._M_string_length = 0;
  local_1d0.OutputLocation.field_2._M_local_buf[0] = '\0';
  local_1d0.RelativePathTopSource._M_dataplus._M_p =
       (pointer)&local_1d0.RelativePathTopSource.field_2;
  local_1d0.RelativePathTopSource._M_string_length = 0;
  local_1d0.RelativePathTopSource.field_2._M_local_buf[0] = '\0';
  local_1d0.RelativePathTopBinary._M_dataplus._M_p =
       (pointer)&local_1d0.RelativePathTopBinary.field_2;
  local_1d0.RelativePathTopBinary._M_string_length = 0;
  local_1d0.RelativePathTopBinary.field_2._M_local_buf[0] = '\0';
  local_1d0.Location._M_dataplus._M_p = (pointer)&local_1d0.Location.field_2;
  memset(&local_1d0.IncludeDirectories,0,0xa8);
  local_1d0.ProjectName._M_string_length = 0;
  local_1d0.ProjectName.field_2._M_local_buf[0] = '\0';
  local_1d0.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d0.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d0.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d0.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0.Children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0.ProjectName._M_dataplus._M_p = (pointer)&local_1d0.ProjectName.field_2;
  local_1d0.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d0.Properties.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = Push_impl(this,it,&local_1d0);
  cmStateDetail::BuildsystemDirectoryStateType::~BuildsystemDirectoryStateType(&local_1d0);
  return iVar1;
}

Assistant:

iterator Push(iterator it) { return Push_impl(it, T()); }